

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_undo_update_spki_table_batch
              (rtr_socket *rtr_socket,spki_table *spki_table,pdu_router_key *pdus,size_t pdu_count)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  ulong uStack_40;
  int res;
  size_t i;
  size_t pdu_count_local;
  pdu_router_key *pdus_local;
  spki_table *spki_table_local;
  rtr_socket *rtr_socket_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_40 = 0;
  do {
    if (pdu_count <= uStack_40) {
      rtr_socket_local._4_4_ = 0;
LAB_001110fa:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return rtr_socket_local._4_4_;
      }
      __stack_chk_fail();
    }
    iVar2 = rtr_undo_update_spki_table(rtr_socket,spki_table,pdus + uStack_40);
    if ((iVar2 == -1) || (iVar2 == -1)) {
      lrtr_dbg(
              "RTR Socket: Couldn\'t undo all update operations from failed data synchronisation: Purging all SPKI records"
              );
      spki_table_src_remove(spki_table,rtr_socket);
      rtr_socket_local._4_4_ = -1;
      goto LAB_001110fa;
    }
    uStack_40 = uStack_40 + 1;
  } while( true );
}

Assistant:

static int rtr_undo_update_spki_table_batch(struct rtr_socket *rtr_socket, struct spki_table *spki_table,
					    struct pdu_router_key *pdus, size_t pdu_count)
{
	for (size_t i = 0; i < pdu_count; i++) {
		int res = rtr_undo_update_spki_table(rtr_socket, spki_table, &(pdus[i]));

		if (res == RTR_ERROR || res == SPKI_ERROR) {
			// Undo failed, cannot recover, remove all records associated with the socket instead
			RTR_DBG1(
				"Couldn't undo all update operations from failed data synchronisation: Purging all SPKI records");
			spki_table_src_remove(spki_table, rtr_socket);
			return RTR_ERROR;
		}
	}
	return RTR_SUCCESS;
}